

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O0

CURLcode getinfo_socket(Curl_easy *data,CURLINFO info,curl_socket_t *param_socketp)

{
  curl_socket_t cVar1;
  curl_socket_t *param_socketp_local;
  CURLINFO info_local;
  Curl_easy *data_local;
  
  if (info == CURLINFO_ACTIVESOCKET) {
    cVar1 = Curl_getconnectinfo(data,(connectdata **)0x0);
    *param_socketp = cVar1;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    data_local._4_4_ = CURLE_UNKNOWN_OPTION;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode getinfo_socket(struct Curl_easy *data, CURLINFO info,
                               curl_socket_t *param_socketp)
{
  switch(info) {
  case CURLINFO_ACTIVESOCKET:
    *param_socketp = Curl_getconnectinfo(data, NULL);
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  }

  return CURLE_OK;
}